

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::UnicodeSet::_generatePattern(UnicodeSet *this,UnicodeString *result,UBool escapeUnprintable)

{
  int iVar1;
  int iVar2;
  UnicodeString *pUVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  UChar local_50 [4];
  ulong local_48;
  UChar local_3e [3];
  ulong local_38;
  
  local_3e[0] = L'[';
  UnicodeString::doAppend(result,local_3e,0,1);
  iVar5 = this->len;
  uVar4 = iVar5 / 2;
  if (((iVar5 < 4) || (*this->list != 0)) || (this->list[(ulong)(uVar4 * 2) - 1] != 0x110000)) {
    if (1 < iVar5) {
      uVar6 = 0;
      local_48 = (ulong)uVar4;
      do {
        iVar1 = this->list[uVar6 * 2];
        iVar2 = this->list[uVar6 * 2 + 1];
        iVar5 = iVar2 + -1;
        _appendToPat(result,iVar1,escapeUnprintable);
        if (iVar1 != iVar5) {
          if (iVar1 != iVar2 + -2) {
            local_50[1] = 0x2d;
            UnicodeString::doAppend(result,local_50 + 1,0,1);
          }
          _appendToPat(result,iVar5,escapeUnprintable);
        }
        uVar6 = uVar6 + 1;
      } while (local_48 != uVar6);
    }
  }
  else {
    local_3e[1] = 0x5e;
    UnicodeString::doAppend(result,local_3e + 1,0,1);
    local_38 = 2;
    if (2 < (int)uVar4) {
      local_38 = (ulong)uVar4;
    }
    uVar6 = 1;
    do {
      iVar1 = this->list[uVar6 * 2 + -1];
      iVar2 = this->list[uVar6 * 2];
      iVar5 = iVar2 + -1;
      _appendToPat(result,iVar1,escapeUnprintable);
      local_48 = CONCAT44(local_48._4_4_,iVar5);
      if (iVar1 != iVar5) {
        if (iVar1 != iVar2 + -2) {
          local_50[0] = L'-';
          UnicodeString::doAppend(result,local_50,0,1);
        }
        _appendToPat(result,(UChar32)local_48,escapeUnprintable);
      }
      uVar6 = uVar6 + 1;
    } while (local_38 != uVar6);
  }
  if (0 < this->strings->count) {
    iVar5 = 0;
    do {
      local_50[2] = 0x7b;
      UnicodeString::doAppend(result,local_50 + 2,0,1);
      pUVar3 = (UnicodeString *)UVector::elementAt(this->strings,iVar5);
      _appendToPat(result,pUVar3,escapeUnprintable);
      local_50[3] = 0x7d;
      UnicodeString::doAppend(result,local_50 + 3,0,1);
      iVar5 = iVar5 + 1;
    } while (iVar5 < this->strings->count);
  }
  local_3e[2] = 0x5d;
  pUVar3 = UnicodeString::doAppend(result,local_3e + 2,0,1);
  return pUVar3;
}

Assistant:

UnicodeString& UnicodeSet::_generatePattern(UnicodeString& result,
                                            UBool escapeUnprintable) const
{
    result.append(SET_OPEN);

//  // Check against the predefined categories.  We implicitly build
//  // up ALL category sets the first time toPattern() is called.
//  for (int8_t cat=0; cat<Unicode::GENERAL_TYPES_COUNT; ++cat) {
//      if (*this == getCategorySet(cat)) {
//          result.append(COLON);
//          result.append(CATEGORY_NAMES, cat*2, 2);
//          return result.append(CATEGORY_CLOSE);
//      }
//  }

    int32_t count = getRangeCount();

    // If the set contains at least 2 intervals and includes both
    // MIN_VALUE and MAX_VALUE, then the inverse representation will
    // be more economical.
    if (count > 1 &&
        getRangeStart(0) == MIN_VALUE &&
        getRangeEnd(count-1) == MAX_VALUE) {

        // Emit the inverse
        result.append(COMPLEMENT);

        for (int32_t i = 1; i < count; ++i) {
            UChar32 start = getRangeEnd(i-1)+1;
            UChar32 end = getRangeStart(i)-1;
            _appendToPat(result, start, escapeUnprintable);
            if (start != end) {
                if ((start+1) != end) {
                    result.append(HYPHEN);
                }
                _appendToPat(result, end, escapeUnprintable);
            }
        }
    }

    // Default; emit the ranges as pairs
    else {
        for (int32_t i = 0; i < count; ++i) {
            UChar32 start = getRangeStart(i);
            UChar32 end = getRangeEnd(i);
            _appendToPat(result, start, escapeUnprintable);
            if (start != end) {
                if ((start+1) != end) {
                    result.append(HYPHEN);
                }
                _appendToPat(result, end, escapeUnprintable);
            }
        }
    }

    for (int32_t i = 0; i<strings->size(); ++i) {
        result.append(OPEN_BRACE);
        _appendToPat(result,
                     *(const UnicodeString*) strings->elementAt(i),
                     escapeUnprintable);
        result.append(CLOSE_BRACE);
    }
    return result.append(SET_CLOSE);
}